

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_enc.cc
# Opt level: O3

bool woff2::ConvertTTFToWOFF2
               (uint8_t *data,size_t length,uint8_t *result,size_t *result_length,
               WOFF2Params *params)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *this;
  uint8_t *puVar2;
  short sVar3;
  undefined8 uVar4;
  iterator iVar5;
  WOFF2Params *pWVar6;
  pointer puVar7;
  pointer pFVar8;
  bool bVar9;
  int iVar10;
  uint32_t uVar11;
  Table *pTVar12;
  Table *pTVar13;
  mapped_type *pmVar14;
  iterator iVar15;
  mapped_type_conflict *pmVar16;
  long lVar17;
  long lVar18;
  _Rb_tree_node_base *p_Var19;
  size_t sVar20;
  size_type sVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  _Base_ptr *pp_Var24;
  key_type kVar25;
  uint uVar26;
  Font *font;
  pointer pFVar27;
  pointer pFVar28;
  Font *pFVar29;
  ulong uVar30;
  key_type kVar31;
  ushort uVar32;
  Font *pFVar33;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *pmVar34;
  uint8_t uVar35;
  char *__format;
  ulong uVar36;
  const_iterator __begin3;
  const_iterator __begin2;
  key_type *pkVar37;
  Table *pTVar38;
  const_iterator __end2;
  long lVar39;
  uint tag;
  vector<woff2::Table,_std::allocator<woff2::Table>_> tables;
  pair<unsigned_int,_unsigned_int> tag_offset;
  uint tag_1;
  map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
  index_by_tag_offset;
  pair<unsigned_int,_unsigned_int> tag_offset_1;
  FontCollection font_collection;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressed_metadata_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> transform_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compression_buf;
  uint local_1c4;
  Table local_1c0;
  Font *local_198;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *local_190;
  Table *local_188;
  iterator iStack_180;
  Table *local_178;
  key_type local_164;
  key_type local_15c;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
  local_158;
  Font *local_128;
  key_type *local_120;
  WOFF2Params *local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  FontCollection local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
  local_60;
  
  local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header;
  local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
  super__Vector_impl_data._M_start = (Font *)0x0;
  local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
  super__Vector_impl_data._M_finish = (Font *)0x0;
  local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar9 = ReadFontCollection(data,length,&local_f8);
  if (bVar9) {
    bVar9 = NormalizeFontCollection(&local_f8);
    if ((bVar9) &&
       ((params->allow_transforms != true || (bVar9 = TransformFontCollection(&local_f8), bVar9))))
    {
      pFVar28 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl
                .super__Vector_impl_data._M_finish;
      pFVar27 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl
                .super__Vector_impl_data._M_start;
      local_120 = (key_type *)result_length;
      local_118 = params;
      if (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0010ad98:
        pmVar34 = (map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                   *)0x0;
      }
      else {
        do {
          pTVar12 = Font::FindTable(pFVar27,0x676c7966);
          pTVar13 = Font::FindTable(pFVar27,0x6c6f6361);
          pFVar8 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pTVar12 != (Table *)0x0) {
            pTVar12->flag_byte = pTVar12->flag_byte | 0xc0;
          }
          if (pTVar13 != (Table *)0x0) {
            pTVar13->flag_byte = pTVar13->flag_byte | 0xc0;
          }
          pFVar27 = pFVar27 + 1;
        } while (pFVar27 != pFVar28);
        if (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_0010ad98;
        pmVar34 = (map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                   *)0x0;
        pFVar28 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          lVar39 = 0;
          for (p_Var19 = (pFVar28->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var19 != &(pFVar28->tables)._M_t._M_impl.super__Rb_tree_header;
              p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
            bVar9 = Font::Table::IsReused((Table *)&p_Var19[1]._M_parent);
            if ((!bVar9) &&
               ((uVar26 = *(uint *)&p_Var19[1]._M_parent, (uVar26 & 0x80808080) != 0 ||
                (pTVar12 = Font::FindTable(pFVar28,uVar26 | 0x80808080), pTVar12 == (Table *)0x0))))
            {
              lVar39 = lVar39 + (ulong)*(uint *)((long)&p_Var19[1]._M_left + 4);
            }
          }
          pmVar34 = (map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                     *)(&(pmVar34->_M_t)._M_impl.field_0x0 + lVar39);
          pFVar28 = pFVar28 + 1;
        } while (pFVar28 != pFVar8);
      }
      pFVar29 = (Font *)((long)((double)((ulong)pmVar34 & 0xffffffff) * 1.2 + 10240.0) & 0xffffffff)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_78,(size_type)pFVar29,(allocator_type *)&local_158);
      local_198 = pFVar29;
      local_190 = pmVar34;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_90,(size_type)pmVar34,(allocator_type *)&local_158);
      pFVar28 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl
                .super__Vector_impl_data._M_finish;
      if (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar39 = 0;
        pFVar27 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          Font::OutputOrderedTags
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_158,pFVar27);
          pFVar29 = (Font *)CONCAT44(local_158._M_impl.super__Rb_tree_header._M_header._4_4_,
                                     local_158._M_impl.super__Rb_tree_header._M_header._M_color);
          if ((Font *)local_158._M_impl._0_8_ != pFVar29) {
            pFVar33 = (Font *)local_158._M_impl._0_8_;
            do {
              local_1c0.tag = pFVar33->flavor;
              pmVar14 = std::
                        map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                        ::at(&pFVar27->tables,&local_1c0.tag);
              bVar9 = Font::Table::IsReused(pmVar14);
              if ((!bVar9) && ((local_1c0._0_8_ & 0x80808080) == 0)) {
                pTVar12 = Font::FindTable(pFVar27,local_1c0.tag | 0x80808080);
                if (pTVar12 != (Table *)0x0) {
                  pmVar14 = pTVar12;
                }
                uVar26 = pmVar14->length;
                memcpy(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar39,pmVar14->data,(ulong)uVar26
                      );
                lVar39 = lVar39 + (ulong)uVar26;
              }
              pFVar33 = (Font *)&pFVar33->num_tables;
            } while (pFVar33 != pFVar29);
          }
          if ((Font *)local_158._M_impl._0_8_ != (Font *)0x0) {
            operator_delete((void *)local_158._M_impl._0_8_);
          }
          pFVar27 = pFVar27 + 1;
        } while (pFVar27 != pFVar28);
      }
      pWVar6 = local_118;
      pmVar34 = local_190;
      local_158._M_impl._0_8_ = local_198;
      iVar10 = BrotliEncoderCompress
                         (local_118->brotli_quality,0x16,2,local_190,
                          local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,&local_158,
                          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      if (iVar10 == 0) {
        ConvertTTFToWOFF2();
        bVar9 = false;
      }
      else {
        local_1c4 = 0;
        local_128 = (Font *)local_158._M_impl._0_8_;
        fprintf(_stderr,"Compressed %zu to %u.\n",pmVar34);
        pFVar29 = (Font *)((long)((double)(uint)(pWVar6->extended_metadata)._M_string_length * 1.2 +
                                 10240.0) & 0xffffffff);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_a8,(size_type)pFVar29,(allocator_type *)&local_158);
        sVar21 = (pWVar6->extended_metadata)._M_string_length;
        if (sVar21 == 0) {
LAB_0010b051:
          local_188 = (Table *)0x0;
          iStack_180._M_current = (Table *)0x0;
          local_178 = (Table *)0x0;
          local_158._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_158._M_impl.super__Rb_tree_header._M_header;
          local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_198 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          local_158._M_impl.super__Rb_tree_header._M_header._M_right =
               local_158._M_impl.super__Rb_tree_header._M_header._M_left;
          if (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pFVar28 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              Font::OutputOrderedTags(&local_110,pFVar28);
              puVar7 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              pkVar37 = (key_type *)
                        CONCAT44(local_110.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (uint)local_110.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
              if (pkVar37 ==
                  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                bVar9 = true;
              }
              else {
                pmVar34 = &pFVar28->tables;
                local_190 = pmVar34;
                do {
                  local_15c = *pkVar37;
                  pmVar14 = std::
                            map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                            ::at(pmVar34,&local_15c);
                  bVar9 = Font::Table::IsReused(pmVar14);
                  if (!bVar9) {
                    local_164.first = pmVar14->tag;
                    local_164.second = pmVar14->offset;
                    iVar15 = std::
                             _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                             ::find(&local_158,&local_164);
                    iVar5._M_current = iStack_180._M_current;
                    pTVar38 = local_188;
                    if ((_Rb_tree_header *)iVar15._M_node !=
                        &local_158._M_impl.super__Rb_tree_header) {
                      bVar9 = false;
                      goto LAB_0010b228;
                    }
                    pmVar16 = std::
                              map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                              ::operator[]((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                            *)&local_158,&local_164);
                    *pmVar16 = (short)((uint)((int)iVar5._M_current - (int)pTVar38) >> 3) * -0x3333;
                    local_1c0.flags._0_1_ = pmVar14->flag_byte;
                    local_1c0.tag = pmVar14->tag;
                    local_1c0.flags._1_3_ = 0;
                    local_1c0.src_length = pmVar14->length;
                    local_1c0.transform_length = local_1c0.src_length;
                    pTVar12 = Font::FindTable(pFVar28,pmVar14->tag ^ 0x80808080);
                    pmVar34 = local_190;
                    if (pTVar12 != (Table *)0x0) {
                      local_1c0._0_8_ =
                           (ulong)CONCAT14(pTVar12->flag_byte,local_1c0.tag) | 0x10000000000;
                      local_1c0.transform_length = pTVar12->length;
                    }
                    if (iStack_180._M_current == local_178) {
                      std::vector<woff2::Table,std::allocator<woff2::Table>>::
                      _M_realloc_insert<woff2::Table_const&>
                                ((vector<woff2::Table,std::allocator<woff2::Table>> *)&local_188,
                                 iStack_180,&local_1c0);
                    }
                    else {
                      (iStack_180._M_current)->dst_data = local_1c0.dst_data;
                      (iStack_180._M_current)->transform_length = local_1c0.transform_length;
                      (iStack_180._M_current)->dst_offset = local_1c0.dst_offset;
                      (iStack_180._M_current)->dst_length = local_1c0.dst_length;
                      *(undefined4 *)&(iStack_180._M_current)->field_0x1c = local_1c0._28_4_;
                      (iStack_180._M_current)->tag = local_1c0.tag;
                      (iStack_180._M_current)->flags = local_1c0.flags;
                      (iStack_180._M_current)->src_offset = local_1c0.src_offset;
                      (iStack_180._M_current)->src_length = local_1c0.src_length;
                      iStack_180._M_current = iStack_180._M_current + 1;
                    }
                  }
                  pkVar37 = pkVar37 + 1;
                } while (pkVar37 != puVar7);
                bVar9 = true;
LAB_0010b228:
                pkVar37 = (key_type *)
                          CONCAT44(local_110.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_110.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              }
              if (pkVar37 != (key_type *)0x0) {
                operator_delete(pkVar37);
              }
              if (!bVar9) {
                bVar9 = false;
                goto LAB_0010b871;
              }
              pFVar28 = pFVar28 + 1;
            } while (pFVar28 != local_198);
          }
          std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
          ::_Rb_tree(&local_60,&local_158);
          iVar5._M_current = iStack_180._M_current;
          lVar39 = 0x30;
          for (pTVar38 = local_188; pTVar38 != iVar5._M_current; pTVar38 = pTVar38 + 1) {
            lVar17 = -0xfc;
            do {
              if (*(uint32_t *)(lVar17 + 0x11213c) == pTVar38->tag) {
                lVar17 = (ulong)(lVar17 == 0) * 4 + 1;
                goto LAB_0010b2b6;
              }
              lVar17 = lVar17 + 4;
            } while (lVar17 != 0);
            lVar17 = 5;
LAB_0010b2b6:
            lVar18 = woff2::Base128Size((ulong)pTVar38->src_length);
            lVar18 = lVar18 + lVar17;
            if ((pTVar38->flags & 0x100) != 0) {
              lVar17 = woff2::Base128Size((ulong)pTVar38->transform_length);
              lVar18 = lVar18 + lVar17;
            }
            lVar39 = lVar39 + lVar18;
          }
          if (local_f8.flavor == 0x74746366) {
            lVar17 = woff2::Size255UShort
                               ((short)((uint)((int)local_f8.fonts.
                                                                                                        
                                                  super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (int)local_f8.fonts.
                                                                                                      
                                                  super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                0x6db7);
            pFVar28 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            lVar39 = lVar39 + lVar17 +
                     ((long)local_f8.fonts.
                            super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_f8.fonts.
                            super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) * -0x4924924924924924 + 4;
            if (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl
                .super__Vector_impl_data._M_start) {
              pFVar27 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                lVar17 = woff2::Size255UShort
                                   ((ushort)(pFVar27->tables)._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count);
                lVar39 = lVar39 + lVar17;
                for (p_Var19 = (pFVar27->tables)._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_left;
                    (_Rb_tree_header *)p_Var19 !=
                    &(pFVar27->tables)._M_t._M_impl.super__Rb_tree_header;
                    p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
                  if ((*(uint *)&p_Var19[1]._M_parent & 0x80808080) == 0) {
                    local_1c0.flags = *(uint *)&p_Var19[1]._M_left;
                    local_1c0.tag = *(uint *)&p_Var19[1]._M_parent;
                    pmVar16 = std::
                              map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                              ::operator[]((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                            *)&local_60,(key_type *)&local_1c0);
                    lVar17 = woff2::Size255UShort(*pmVar16);
                    lVar39 = lVar39 + lVar17;
                  }
                }
                pFVar27 = pFVar27 + 1;
              } while (pFVar27 != pFVar28);
            }
          }
          local_198 = (Font *)((ulong)local_128 & 0xffffffff);
          local_190 = (map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                       *)(ulong)local_1c4;
          uVar36 = (long)&local_198->flavor + lVar39;
          uVar30 = (long)&local_198->flavor + lVar39 + 3 & 0xfffffffffffffffc;
          if (0xfffffffffffffffc < uVar36) {
            uVar30 = uVar36;
          }
          kVar31 = (key_type)(&(local_190->_M_t)._M_impl.field_0x0 + uVar30);
          std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
          ::~_Rb_tree(&local_60);
          kVar25 = *local_120;
          if ((ulong)kVar25 < (ulong)kVar31) {
            __format = "Result allocation was too small (%zd vs %zd bytes).\n";
LAB_0010b923:
            bVar9 = false;
            fprintf(_stderr,__format,kVar25,kVar31);
          }
          else {
            *local_120 = kVar31;
            builtin_memcpy(result,"wOF2",4);
            if (local_f8.flavor == 0x74746366) {
              uVar11 = 0x66;
              uVar23 = 'c';
              uVar22 = 't';
              uVar35 = 't';
            }
            else {
              uVar11 = (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                        ._M_impl.super__Vector_impl_data._M_start)->flavor;
              uVar22 = (uint8_t)(uVar11 >> 0x18);
              uVar35 = (uint8_t)(uVar11 >> 0x10);
              uVar23 = (uint8_t)(uVar11 >> 8);
            }
            result[4] = uVar22;
            result[5] = uVar35;
            result[6] = uVar23;
            result[7] = (uint8_t)uVar11;
            result[8] = kVar31.first._3_1_;
            result[9] = kVar31.first._2_1_;
            result[10] = kVar31.first._1_1_;
            result[0xb] = (uint8_t)kVar31.first;
            sVar3 = (short)((uint)((int)iStack_180._M_current - (int)local_188) >> 3);
            *(ushort *)(result + 0xc) = sVar3 * -0x3300 | (ushort)(sVar3 * -0x3333) >> 8;
            result[0xe] = '\0';
            result[0xf] = '\0';
            local_1c0.tag = 0x10;
            local_1c0.flags = 0;
            sVar20 = anon_unknown_0::ComputeUncompressedLength(&local_f8);
            iVar5._M_current = iStack_180._M_current;
            result[local_1c0._0_8_] = (uint8_t)(sVar20 >> 0x18);
            result[local_1c0._0_8_ + 1] = (uint8_t)(sVar20 >> 0x10);
            result[local_1c0._0_8_ + 2] = (uint8_t)(sVar20 >> 8);
            result[local_1c0._0_8_ + 3] = (uint8_t)sVar20;
            result[local_1c0._0_8_ + 4] = (uint8_t)((ulong)local_128 >> 0x18);
            result[local_1c0._0_8_ + 5] = (uint8_t)((ulong)local_128 >> 0x10);
            result[local_1c0._0_8_ + 6] = (uint8_t)((ulong)local_128 >> 8);
            result[local_1c0._0_8_ + 7] = (uint8_t)local_128;
            puVar2 = result + local_1c0._0_8_ + 8;
            puVar2[0] = '\0';
            puVar2[1] = '\x01';
            puVar2[2] = '\0';
            puVar2[3] = '\0';
            if (local_1c4 == 0) {
              puVar2 = result + local_1c0._0_8_ + 0xc;
              puVar2[0] = '\0';
              puVar2[1] = '\0';
              puVar2[2] = '\0';
              puVar2[3] = '\0';
              puVar2[4] = '\0';
              puVar2[5] = '\0';
              puVar2[6] = '\0';
              puVar2[7] = '\0';
              (result + local_1c0._0_8_ + 0x14)[0] = '\0';
              (result + local_1c0._0_8_ + 0x14)[1] = '\0';
              result[local_1c0._0_8_ + 0x16] = '\0';
              sVar21 = 0;
            }
            else {
              uVar26 = kVar31.first - local_1c4;
              *(uint *)(result + local_1c0._0_8_ + 0xc) =
                   uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                   uVar26 * 0x1000000;
              result[local_1c0._0_8_ + 0x10] = (uint8_t)(local_1c4 >> 0x18);
              result[local_1c0._0_8_ + 0x11] = (uint8_t)(local_1c4 >> 0x10);
              result[local_1c0._0_8_ + 0x12] = (uint8_t)(local_1c4 >> 8);
              result[local_1c0._0_8_ + 0x13] = (uint8_t)local_1c4;
              sVar21 = (local_118->extended_metadata)._M_string_length;
              result[local_1c0._0_8_ + 0x14] = (uint8_t)(sVar21 >> 0x18);
              result[local_1c0._0_8_ + 0x15] = (uint8_t)(sVar21 >> 0x10);
              result[local_1c0._0_8_ + 0x16] = (uint8_t)(sVar21 >> 8);
            }
            result[local_1c0._0_8_ + 0x17] = (uint8_t)sVar21;
            kVar25 = (key_type)(local_1c0._0_8_ + 0x20);
            puVar2 = result + local_1c0._0_8_ + 0x18;
            puVar2[0] = '\0';
            puVar2[1] = '\0';
            puVar2[2] = '\0';
            puVar2[3] = '\0';
            puVar2[4] = '\0';
            puVar2[5] = '\0';
            puVar2[6] = '\0';
            puVar2[7] = '\0';
            local_1c0._0_8_ = kVar25;
            if (local_188 != iStack_180._M_current) {
              pTVar38 = local_188;
              do {
                lVar39 = 0;
                do {
                  if (*(uint32_t *)((long)&kKnownTags + lVar39 * 4) == pTVar38->tag)
                  goto LAB_0010b5c9;
                  lVar39 = lVar39 + 1;
                } while (lVar39 != 0x3f);
                lVar39 = 0x3f;
LAB_0010b5c9:
                result[local_1c0._0_8_] = (byte)pTVar38->flags & 0xc0 | (byte)lVar39;
                kVar25 = (key_type)(local_1c0._0_8_ + 1);
                if ((~(uint)lVar39 & 0x3f) == 0) {
                  uVar11 = pTVar38->tag;
                  result[(long)(local_1c0._0_8_ + 1)] = (uint8_t)(uVar11 >> 0x18);
                  result[(long)(local_1c0._0_8_ + 2)] = (uint8_t)(uVar11 >> 0x10);
                  result[(long)(local_1c0._0_8_ + 3)] = (uint8_t)(uVar11 >> 8);
                  result[(long)(local_1c0._0_8_ + 4)] = (uint8_t)uVar11;
                  kVar25 = (key_type)(local_1c0._0_8_ + 5);
                }
                local_1c0._0_8_ = kVar25;
                woff2::StoreBase128((ulong)pTVar38->src_length,(ulong *)&local_1c0,result);
                if ((pTVar38->flags & 0x100) != 0) {
                  woff2::StoreBase128((ulong)pTVar38->transform_length,(ulong *)&local_1c0,result);
                }
                pTVar38 = pTVar38 + 1;
              } while (pTVar38 != iVar5._M_current);
            }
            if (local_f8.flavor == 0x74746366) {
              result[local_1c0._0_8_] = (uint8_t)(local_f8.header_version >> 0x18);
              result[(long)(local_1c0._0_8_ + 1)] = (uint8_t)(local_f8.header_version >> 0x10);
              result[(long)(local_1c0._0_8_ + 2)] = (uint8_t)(local_f8.header_version >> 8);
              result[(long)(local_1c0._0_8_ + 3)] = (uint8_t)local_f8.header_version;
              local_1c0._0_8_ = local_1c0._0_8_ + 4;
              woff2::Store255UShort
                        ((int)((ulong)((long)local_f8.fonts.
                                             super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_f8.fonts.
                                            super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x49249249,(ulong *)&local_1c0,result);
              pFVar28 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pFVar29 = local_f8.fonts.
                             super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                             super__Vector_impl_data._M_start; pFVar29 != pFVar28;
                  pFVar29 = pFVar29 + 1) {
                p_Var19 = (pFVar29->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                p_Var1 = &(pFVar29->tables)._M_t._M_impl.super__Rb_tree_header;
                if ((_Rb_tree_header *)p_Var19 == p_Var1) {
                  uVar26 = 0;
                }
                else {
                  uVar32 = 0;
                  do {
                    uVar32 = uVar32 + (((ulong)p_Var19[1]._M_parent & 0x80808080) == 0);
                    p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
                  } while ((_Rb_tree_header *)p_Var19 != p_Var1);
                  uVar26 = (uint)uVar32;
                }
                woff2::Store255UShort(uVar26,(ulong *)&local_1c0,result);
                uVar11 = pFVar29->flavor;
                result[local_1c0._0_8_] = (uint8_t)(uVar11 >> 0x18);
                result[(long)(local_1c0._0_8_ + 1)] = (uint8_t)(uVar11 >> 0x10);
                result[(long)(local_1c0._0_8_ + 2)] = (uint8_t)(uVar11 >> 8);
                result[(long)(local_1c0._0_8_ + 3)] = (uint8_t)uVar11;
                local_1c0._0_8_ = local_1c0._0_8_ + 4;
                for (p_Var19 = (pFVar29->tables)._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_left; (_Rb_tree_header *)p_Var19 != p_Var1;
                    p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
                  if (((ulong)p_Var19[1]._M_parent & 0x80808080) == 0) {
                    this = &p_Var19[1]._M_parent;
                    bVar9 = Font::Table::IsReused((Table *)this);
                    pp_Var24 = &p_Var19[1]._M_left;
                    if (bVar9) {
                      pp_Var24 = &(p_Var19[2]._M_right)->_M_parent;
                    }
                    uVar26 = *(uint *)pp_Var24;
                    Font::Table::IsReused((Table *)this);
                    local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start._0_4_ = *(uint *)this;
                    local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start._4_4_ = uVar26;
                    iVar15 = std::
                             _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                             ::find(&local_158,(key_type *)&local_110);
                    if ((_Rb_tree_header *)iVar15._M_node ==
                        &local_158._M_impl.super__Rb_tree_header) {
                      bVar9 = false;
                      fprintf(_stderr,"Missing table index for offset 0x%08x\n",(ulong)uVar26);
                      goto LAB_0010b871;
                    }
                    pmVar16 = std::
                              map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                              ::operator[]((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                            *)&local_158,(key_type *)&local_110);
                    woff2::Store255UShort((uint)*pmVar16,(ulong *)&local_1c0,result);
                  }
                }
              }
            }
            pFVar29 = local_198;
            uVar4 = local_1c0._0_8_;
            memcpy(result + local_1c0._0_8_,
                   local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(size_t)local_198);
            pmVar34 = local_190;
            kVar25 = (key_type)((long)&pFVar29->flavor + uVar4);
            kVar31 = (key_type)
                     ((ulong)((long)&pFVar29->flavor + (long)(uVar4 + 3)) & 0xfffffffffffffffc);
            if (0xfffffffffffffffc < (ulong)kVar25) {
              kVar31 = kVar25;
            }
            local_1c0._0_8_ = kVar31;
            memcpy(result + (long)kVar31,
                   local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(size_t)local_190);
            kVar31 = (key_type)(&(pmVar34->_M_t)._M_impl.field_0x0 + (long)kVar31);
            kVar25 = *local_120;
            bVar9 = true;
            local_1c0._0_8_ = kVar31;
            if (kVar25 != kVar31) {
              __format = "Mismatch between computed and actual length (%zd vs %zd)\n";
              goto LAB_0010b923;
            }
          }
LAB_0010b871:
          std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
          ::~_Rb_tree(&local_158);
          if (local_188 != (Table *)0x0) {
            operator_delete(local_188);
          }
        }
        else {
          local_158._M_impl._0_8_ = pFVar29;
          iVar10 = BrotliEncoderCompress
                             (pWVar6->brotli_quality,0x16,1,sVar21,
                              (pWVar6->extended_metadata)._M_dataplus._M_p,&local_158,
                              local_a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
          if (iVar10 != 0) {
            local_1c4 = local_158._M_impl._0_4_;
            goto LAB_0010b051;
          }
          ConvertTTFToWOFF2();
          bVar9 = false;
        }
        if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0010ace6;
    }
  }
  else {
    ConvertTTFToWOFF2();
  }
  bVar9 = false;
LAB_0010ace6:
  std::vector<woff2::Font,_std::allocator<woff2::Font>_>::~vector(&local_f8.fonts);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table_*>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
  ::~_Rb_tree(&local_f8.tables._M_t);
  return bVar9;
}

Assistant:

bool ConvertTTFToWOFF2(const uint8_t *data, size_t length,
                       uint8_t *result, size_t *result_length,
                       const WOFF2Params& params) {
  FontCollection font_collection;
  if (!ReadFontCollection(data, length, &font_collection)) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Parsing of the input font failed.\n");
#endif
    return FONT_COMPRESSION_FAILURE();
  }

  if (!NormalizeFontCollection(&font_collection)) {
    return FONT_COMPRESSION_FAILURE();
  }

  if (params.allow_transforms && !TransformFontCollection(&font_collection)) {
    return FONT_COMPRESSION_FAILURE();
  } else {
    // glyf/loca use 11 to flag "not transformed"
    for (auto& font : font_collection.fonts) {
      Font::Table* glyf_table = font.FindTable(kGlyfTableTag);
      Font::Table* loca_table = font.FindTable(kLocaTableTag);
      if (glyf_table) {
        glyf_table->flag_byte |= 0xc0;
      }
      if (loca_table) {
        loca_table->flag_byte |= 0xc0;
      }
    }
  }

  // Although the compressed size of each table in the final woff2 file won't
  // be larger than its transform_length, we have to allocate a large enough
  // buffer for the compressor, since the compressor can potentially increase
  // the size. If the compressor overflows this, it should return false and
  // then this function will also return false.

  size_t total_transform_length = 0;
  for (const auto& font : font_collection.fonts) {
    total_transform_length += ComputeTotalTransformLength(font);
  }
  size_t compression_buffer_size = CompressedBufferSize(total_transform_length);
  std::vector<uint8_t> compression_buf(compression_buffer_size);
  uint32_t total_compressed_length = compression_buffer_size;

  // Collect all transformed data into one place in output order.
  std::vector<uint8_t> transform_buf(total_transform_length);
  size_t transform_offset = 0;
  for (const auto& font : font_collection.fonts) {
    for (const auto tag : font.OutputOrderedTags()) {
      const Font::Table& original = font.tables.at(tag);
      if (original.IsReused()) continue;
      if (tag & 0x80808080) continue;
      const Font::Table* table_to_store = font.FindTable(tag ^ 0x80808080);
      if (table_to_store == NULL) table_to_store = &original;

      StoreBytes(table_to_store->data, table_to_store->length,
                 &transform_offset, &transform_buf[0]);
    }
  }

  // Compress all transformed data in one stream.
  if (!Woff2Compress(transform_buf.data(), total_transform_length,
                     &compression_buf[0],
                     &total_compressed_length,
                     params.brotli_quality)) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Compression of combined table failed.\n");
#endif
    return FONT_COMPRESSION_FAILURE();
  }

#ifdef FONT_COMPRESSION_BIN
  fprintf(stderr, "Compressed %zu to %u.\n", total_transform_length,
          total_compressed_length);
#endif

  // Compress the extended metadata
  // TODO(user): how does this apply to collections
  uint32_t compressed_metadata_buf_length =
    CompressedBufferSize(params.extended_metadata.length());
  std::vector<uint8_t> compressed_metadata_buf(compressed_metadata_buf_length);

  if (params.extended_metadata.length() > 0) {
    if (!TextCompress((const uint8_t*)params.extended_metadata.data(),
                      params.extended_metadata.length(),
                      compressed_metadata_buf.data(),
                      &compressed_metadata_buf_length,
                      params.brotli_quality)) {
#ifdef FONT_COMPRESSION_BIN
      fprintf(stderr, "Compression of extended metadata failed.\n");
#endif
      return FONT_COMPRESSION_FAILURE();
    }
  } else {
    compressed_metadata_buf_length = 0;
  }

  std::vector<Table> tables;
  std::map<std::pair<uint32_t, uint32_t>, uint16_t> index_by_tag_offset;

  for (const auto& font : font_collection.fonts) {

    for (const auto tag : font.OutputOrderedTags()) {
      const Font::Table& src_table = font.tables.at(tag);
      if (src_table.IsReused()) {
        continue;
      }

      std::pair<uint32_t, uint32_t> tag_offset(src_table.tag, src_table.offset);
      if (index_by_tag_offset.find(tag_offset) == index_by_tag_offset.end()) {
        index_by_tag_offset[tag_offset] = tables.size();
      } else {
        return false;
      }

      Table table;
      table.tag = src_table.tag;
      table.flags = src_table.flag_byte;
      table.src_length = src_table.length;
      table.transform_length = src_table.length;
      const uint8_t* transformed_data = src_table.data;
      const Font::Table* transformed_table =
          font.FindTable(src_table.tag ^ 0x80808080);
      if (transformed_table != NULL) {
        table.flags = transformed_table->flag_byte;
        table.flags |= kWoff2FlagsTransform;
        table.transform_length = transformed_table->length;
        transformed_data = transformed_table->data;

      }
      tables.push_back(table);
    }
  }

  size_t woff2_length = ComputeWoff2Length(font_collection, tables,
      index_by_tag_offset, total_compressed_length,
      compressed_metadata_buf_length);
  if (woff2_length > *result_length) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Result allocation was too small (%zd vs %zd bytes).\n",
           *result_length, woff2_length);
#endif
    return FONT_COMPRESSION_FAILURE();
  }
  *result_length = woff2_length;

  size_t offset = 0;

  // start of woff2 header (http://www.w3.org/TR/WOFF2/#woff20Header)
  StoreU32(kWoff2Signature, &offset, result);
  if (font_collection.flavor != kTtcFontFlavor) {
    StoreU32(font_collection.fonts[0].flavor, &offset, result);
  } else {
    StoreU32(kTtcFontFlavor, &offset, result);
  }
  StoreU32(woff2_length, &offset, result);
  Store16(tables.size(), &offset, result);
  Store16(0, &offset, result);  // reserved
  // totalSfntSize
  StoreU32(ComputeUncompressedLength(font_collection), &offset, result);
  StoreU32(total_compressed_length, &offset, result);  // totalCompressedSize

  // Let's just all be v1.0
  Store16(1, &offset, result);  // majorVersion
  Store16(0, &offset, result);  // minorVersion
  if (compressed_metadata_buf_length > 0) {
    StoreU32(woff2_length - compressed_metadata_buf_length,
             &offset, result);  // metaOffset
    StoreU32(compressed_metadata_buf_length, &offset, result);  // metaLength
    StoreU32(params.extended_metadata.length(),
             &offset, result);  // metaOrigLength
  } else {
    StoreU32(0, &offset, result);  // metaOffset
    StoreU32(0, &offset, result);  // metaLength
    StoreU32(0, &offset, result);  // metaOrigLength
  }
  StoreU32(0, &offset, result);  // privOffset
  StoreU32(0, &offset, result);  // privLength
  // end of woff2 header

  // table directory (http://www.w3.org/TR/WOFF2/#table_dir_format)
  for (const auto& table : tables) {
    StoreTableEntry(table, &offset, result);
  }

  // for collections only, collection table directory
  if (font_collection.flavor == kTtcFontFlavor) {
    StoreU32(font_collection.header_version, &offset, result);
    Store255UShort(font_collection.fonts.size(), &offset, result);
    for (const Font& font : font_collection.fonts) {

      uint16_t num_tables = 0;
      for (const auto& entry : font.tables) {
        const Font::Table& table = entry.second;
        if (table.tag & 0x80808080) continue;  // don't write xform tables
        num_tables++;
      }
      Store255UShort(num_tables, &offset, result);

      StoreU32(font.flavor, &offset, result);
      for (const auto& entry : font.tables) {
        const Font::Table& table = entry.second;
        if (table.tag & 0x80808080) continue;  // don't write xform tables

        // for reused tables, only the original has an updated offset
        uint32_t table_offset =
          table.IsReused() ? table.reuse_of->offset : table.offset;
        uint32_t table_length =
          table.IsReused() ? table.reuse_of->length : table.length;
        std::pair<uint32_t, uint32_t> tag_offset(table.tag, table_offset);
        if (index_by_tag_offset.find(tag_offset) == index_by_tag_offset.end()) {
#ifdef FONT_COMPRESSION_BIN
fprintf(stderr, "Missing table index for offset 0x%08x\n",
                  table_offset);
#endif
          return FONT_COMPRESSION_FAILURE();
        }
        uint16_t index = index_by_tag_offset[tag_offset];
        Store255UShort(index, &offset, result);

      }

    }
  }

  // compressed data format (http://www.w3.org/TR/WOFF2/#table_format)

  StoreBytes(&compression_buf[0], total_compressed_length, &offset, result);
  offset = Round4(offset);

  StoreBytes(compressed_metadata_buf.data(), compressed_metadata_buf_length,
             &offset, result);

  if (*result_length != offset) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Mismatch between computed and actual length "
            "(%zd vs %zd)\n", *result_length, offset);
#endif
    return FONT_COMPRESSION_FAILURE();
  }
  return true;
}